

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric_manager.hpp
# Opt level: O2

dynamic_metric_manager<test_id_t<4UL>_> *
ylt::metric::dynamic_metric_manager<test_id_t<4UL>_>::instance(void)

{
  int iVar1;
  dynamic_metric_manager<test_id_t<4UL>_> *this;
  
  if (dynamic_metric_manager<test_id_t<4ul>>::instance()::inst == '\0') {
    iVar1 = __cxa_guard_acquire(&dynamic_metric_manager<test_id_t<4ul>>::instance()::inst);
    if (iVar1 != 0) {
      this = (dynamic_metric_manager<test_id_t<4UL>_> *)operator_new(0x40);
      dynamic_metric_manager(this);
      instance::inst = this;
      __cxa_guard_release(&dynamic_metric_manager<test_id_t<4ul>>::instance()::inst);
    }
  }
  return instance::inst;
}

Assistant:

static dynamic_metric_manager<Tag>& instance() {
    static auto* inst = new dynamic_metric_manager<Tag>();
    return *inst;
  }